

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_pts_landmarks.hpp
# Opt level: O1

LandmarkCollection<Eigen::Vector2f> *
eos::core::read_pts_landmarks
          (LandmarkCollection<Eigen::Vector2f> *__return_storage_ptr__,string *filename)

{
  uint uVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  istream *piVar5;
  runtime_error *prVar6;
  ulong uVar7;
  uint __val;
  uint __len;
  string line;
  Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_> landmark;
  string __str;
  stringstream lineStream;
  ifstream file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_428;
  Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_> local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0 [4];
  ios_base local_340 [264];
  long local_238 [4];
  byte abStack_218 [488];
  
  (__return_storage_ptr__->
  super__Vector_base<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
  ::reserve(__return_storage_ptr__,0x44);
  std::ifstream::ifstream(local_238,(string *)filename,_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) {
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(local_3c0,"Could not open landmark file: ",filename);
    std::runtime_error::runtime_error(prVar6,(string *)local_3c0);
    __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
  local_428._M_string_length = 0;
  local_428.field_2._M_local_buf[0] = '\0';
  cVar2 = std::ios::widen((char)local_238 + (char)*(undefined8 *)(local_238[0] + -0x18));
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_238,(string *)&local_428,cVar2);
  cVar2 = std::ios::widen((char)(istream *)local_238 + (char)*(undefined8 *)(local_238[0] + -0x18));
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_238,(string *)&local_428,cVar2);
  cVar2 = std::ios::widen((char)(istream *)local_238 + (char)*(undefined8 *)(local_238[0] + -0x18));
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)local_238,(string *)&local_428,cVar2);
  __val = 1;
  while( true ) {
    cVar2 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)(istream *)local_238
                           );
    piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_238,(string *)&local_428,cVar2);
    if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
    iVar3 = std::__cxx11::string::compare((char *)&local_428);
    if (iVar3 == 0) break;
    std::__cxx11::stringstream::stringstream
              ((stringstream *)local_3c0,(string *)&local_428,_S_out|_S_in);
    local_408.name._M_string_length = 0;
    local_408.name.field_2._M_local_buf[0] = '\0';
    __len = 1;
    if (9 < __val) {
      uVar7 = (ulong)__val;
      uVar1 = 4;
      do {
        __len = uVar1;
        uVar4 = (uint)uVar7;
        if (uVar4 < 100) {
          __len = __len - 2;
          goto LAB_0010bed6;
        }
        if (uVar4 < 1000) {
          __len = __len - 1;
          goto LAB_0010bed6;
        }
        if (uVar4 < 10000) goto LAB_0010bed6;
        uVar7 = uVar7 / 10000;
        uVar1 = __len + 4;
      } while (99999 < uVar4);
      __len = __len + 1;
    }
LAB_0010bed6:
    local_408.name._M_dataplus._M_p = (pointer)&local_408.name.field_2;
    local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_3e0,(char)__len);
    std::__detail::__to_chars_10_impl<unsigned_int>(local_3e0._M_dataplus._M_p,__len,__val);
    std::__cxx11::string::operator=((string *)&local_408,(string *)&local_3e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
      operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
    }
    piVar5 = std::istream::_M_extract<float>((float *)local_3c0);
    piVar5 = std::istream::_M_extract<float>((float *)piVar5);
    if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_3e0,"Landmark format error while parsing the line: ",&local_428);
      std::runtime_error::runtime_error(prVar6,(string *)&local_3e0);
      __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_408.coordinates.super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.
    m_data.array[0] =
         local_408.coordinates.super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage
         .m_data.array[0] + -1.0;
    local_408.coordinates.super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.
    m_data.array[1] =
         local_408.coordinates.super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage
         .m_data.array[1] + -1.0;
    std::
    vector<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>,std::allocator<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>>>
    ::emplace_back<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>&>
              ((vector<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>,std::allocator<eos::core::Landmark<Eigen::Matrix<float,2,1,0,2,1>>>>
                *)__return_storage_ptr__,&local_408);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408.name._M_dataplus._M_p != &local_408.name.field_2) {
      operator_delete(local_408.name._M_dataplus._M_p,
                      CONCAT71(local_408.name.field_2._M_allocated_capacity._1_7_,
                               local_408.name.field_2._M_local_buf[0]) + 1);
    }
    __val = __val + 1;
    std::__cxx11::stringstream::~stringstream((stringstream *)local_3c0);
    std::ios_base::~ios_base(local_340);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428._M_dataplus._M_p != &local_428.field_2) {
    operator_delete(local_428._M_dataplus._M_p,
                    CONCAT71(local_428.field_2._M_allocated_capacity._1_7_,
                             local_428.field_2._M_local_buf[0]) + 1);
  }
  std::ifstream::~ifstream(local_238);
  return __return_storage_ptr__;
}

Assistant:

inline LandmarkCollection<Eigen::Vector2f> read_pts_landmarks(std::string filename)
{
    using Eigen::Vector2f;
    using std::getline;
    using std::string;
    LandmarkCollection<Vector2f> landmarks;
    landmarks.reserve(68);

    std::ifstream file(filename);
    if (!file)
    {
        throw std::runtime_error(string("Could not open landmark file: " + filename));
    }

    string line;
    // Skip the first 3 lines, they're header lines:
    getline(file, line); // 'version: 1'
    getline(file, line); // 'n_points : 68'
    getline(file, line); // '{'

    int ibugId = 1;
    while (getline(file, line))
    {
        if (line == "}")
        { // end of the file
            break;
        }
        std::stringstream lineStream(line);

        Landmark<Vector2f> landmark;
        landmark.name = std::to_string(ibugId);
        if (!(lineStream >> landmark.coordinates[0] >> landmark.coordinates[1]))
        {
            throw std::runtime_error(string("Landmark format error while parsing the line: " + line));
        }
        // From the iBug website:
        // "Please note that the re-annotated data for this challenge are saved in the Matlab convention of 1
        // being the first index, i.e. the coordinates of the top left pixel in an image are x=1, y=1."
        // ==> So we shift every point by 1:
        landmark.coordinates[0] -= 1.0f;
        landmark.coordinates[1] -= 1.0f;
        landmarks.emplace_back(landmark);
        ++ibugId;
    }
    return landmarks;
}